

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseStart(StreamingListener *this,TestCase *test_case)

{
  string *in_RDI;
  StreamingListener *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined1 local_51 [33];
  string local_30 [48];
  
  this_00 = (StreamingListener *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_51 + 1),"event=TestCaseStart&name=",(allocator *)this_00);
  TestSuite::name((TestSuite *)0x15f798);
  std::operator+(in_stack_ffffffffffffff98,(char *)this_00);
  SendLn(this_00,in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  return;
}

Assistant:

void OnTestCaseStart(const TestCase& test_case) override {
    SendLn(std::string("event=TestCaseStart&name=") + test_case.name());
  }